

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldUnittest.cpp
# Opt level: O2

void __thiscall FieldUnittest_Register_Test::TestBody(FieldUnittest_Register_Test *this)

{
  String *pSVar1;
  scoped_ptr<testing::internal::String> sVar2;
  int iVar3;
  DataFieldInfo *pDVar4;
  Serializer *this_00;
  scoped_ptr<testing::internal::String> *this_01;
  char *pcVar5;
  AssertHelper local_e0;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int bytesPerElement;
  int lMinusHaloSize;
  int kMinusHaloSize;
  int jMinusHaloSize;
  int iMinusHaloSize;
  int lSize;
  int kSize;
  int jSize;
  int iSize;
  int lPlusHaloSize;
  int kPlusHaloSize;
  int jPlusHaloSize;
  int iPlusHaloSize;
  string local_70;
  string local_50;
  
  this_00 = &(this->super_FieldUnittest).ser;
  ser::Serializer::fieldnames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&gtest_ar,this_00);
  sVar2 = gtest_ar.message_;
  pSVar1 = (String *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  this_01 = &gtest_ar_.message_;
  gtest_ar_.success_ = pSVar1 == gtest_ar.message_.ptr_;
  gtest_ar_.message_.ptr_ = (String *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar);
  if (pSVar1 == sVar2.ptr_) {
    testing::internal::scoped_ptr<testing::internal::String>::~scoped_ptr(this_01);
    gtest_ar_.success_ = false;
    gtest_ar_._1_3_ = 0;
    local_e0.data_._0_4_ = fs_fields(this_00);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"0","fs_fields(&ser)",(int *)&gtest_ar_,(int *)&local_e0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (gtest_ar.message_.ptr_ == (String *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = "";
        if ((gtest_ar.message_.ptr_)->c_str_ != (char *)0x0) {
          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
        }
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                 ,0x21,pcVar5);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&gtest_ar_);
      this_01 = &gtest_ar.message_;
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
      }
    }
    else {
      testing::internal::scoped_ptr<testing::internal::String>::~scoped_ptr(&gtest_ar.message_);
      std::__cxx11::string::string((string *)&gtest_ar,"field1",(allocator *)&gtest_ar_);
      std::__cxx11::string::string((string *)&local_50,"int",(allocator *)&local_e0);
      ser::Serializer::RegisterField
                (this_00,(string *)&gtest_ar,&local_50,4,0x2a,1,1,0xc,1,1,0,0,0,0,2,2);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&gtest_ar);
      std::__cxx11::string::string((string *)&gtest_ar,"field2",(allocator *)&gtest_ar_);
      std::__cxx11::string::string((string *)&local_70,"double",(allocator *)&local_e0);
      ser::Serializer::RegisterField
                (this_00,(string *)&gtest_ar,&local_70,8,0x2a,0x1c,0x50,1,3,3,3,3,0,1,0,0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&gtest_ar);
      fs_register_field(this_00,"field3",6,"int",3,4,0x2a,1,0x50,1,3,3,0,0,0,1,0,0);
      fs_register_field(this_00,"field4",6,"double",6,8,1,0x1c,0x50,0xc,0,0,2,2,0,0,1,1);
      iVar3 = fs_field_exists(this_00,"field1",6);
      gtest_ar.message_.ptr_ = (String *)0x0;
      this_01 = &gtest_ar.message_;
      gtest_ar.success_ = iVar3 != 0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)&local_e0);
        testing::internal::GetBoolAssertionFailureMessage
                  ((internal *)&gtest_ar_,&gtest_ar,"fs_field_exists(&ser, \"field1\", 6)","false",
                   "true");
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&bytesPerElement,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                   ,0x2c,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&bytesPerElement,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bytesPerElement);
        testing::internal::String::~String((String *)&gtest_ar_);
        if (local_e0.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_e0.data_ + 8))();
        }
      }
      else {
        testing::internal::scoped_ptr<testing::internal::String>::~scoped_ptr(this_01);
        iVar3 = fs_field_exists(this_00,"field2",6);
        this_01 = &gtest_ar.message_;
        gtest_ar.message_.ptr_ = (String *)0x0;
        gtest_ar.success_ = iVar3 != 0;
        if (iVar3 == 0) {
          testing::Message::Message((Message *)&local_e0);
          testing::internal::GetBoolAssertionFailureMessage
                    ((internal *)&gtest_ar_,&gtest_ar,"fs_field_exists(&ser, \"field2\", 6)","false"
                     ,"true");
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&bytesPerElement,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                     ,0x2d,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&bytesPerElement,(Message *)&local_e0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bytesPerElement);
          testing::internal::String::~String((String *)&gtest_ar_);
          if (local_e0.data_ != (AssertHelperData *)0x0) {
            (**(code **)(*(long *)local_e0.data_ + 8))();
          }
        }
        else {
          testing::internal::scoped_ptr<testing::internal::String>::~scoped_ptr(this_01);
          iVar3 = fs_field_exists(this_00,"field3",6);
          this_01 = &gtest_ar.message_;
          gtest_ar.message_.ptr_ = (String *)0x0;
          gtest_ar.success_ = iVar3 != 0;
          if (iVar3 == 0) {
            testing::Message::Message((Message *)&local_e0);
            testing::internal::GetBoolAssertionFailureMessage
                      ((internal *)&gtest_ar_,&gtest_ar,"fs_field_exists(&ser, \"field3\", 6)",
                       "false","true");
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&bytesPerElement,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                       ,0x2e,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&bytesPerElement,(Message *)&local_e0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bytesPerElement);
            testing::internal::String::~String((String *)&gtest_ar_);
            if (local_e0.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_e0.data_ + 8))();
            }
          }
          else {
            testing::internal::scoped_ptr<testing::internal::String>::~scoped_ptr(this_01);
            iVar3 = fs_field_exists(this_00,"field4",6);
            this_01 = &gtest_ar.message_;
            gtest_ar.message_.ptr_ = (String *)0x0;
            gtest_ar.success_ = iVar3 != 0;
            if (gtest_ar.success_) {
              testing::internal::scoped_ptr<testing::internal::String>::~scoped_ptr(this_01);
              bytesPerElement = 4;
              ser::Serializer::fieldnames_abi_cxx11_
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&gtest_ar,this_00);
              local_e0.data_ =
                   (AssertHelperData *)
                   ((long)gtest_ar.message_.ptr_ - CONCAT71(gtest_ar._1_7_,gtest_ar.success_) >> 5);
              testing::internal::CmpHelperEQ<int,unsigned_long>
                        ((internal *)&gtest_ar_,"4","ser.fieldnames().size()",&bytesPerElement,
                         (unsigned_long *)&local_e0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar);
              if (gtest_ar_.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar);
                if (gtest_ar_.message_.ptr_ == (String *)0x0) {
                  pcVar5 = "";
                }
                else {
                  pcVar5 = "";
                  if ((gtest_ar_.message_.ptr_)->c_str_ != (char *)0x0) {
                    pcVar5 = (gtest_ar_.message_.ptr_)->c_str_;
                  }
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_e0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                           ,0x31,pcVar5);
                testing::internal::AssertHelper::operator=(&local_e0,(Message *)&gtest_ar);
                this_01 = &gtest_ar_.message_;
                testing::internal::AssertHelper::~AssertHelper(&local_e0);
                if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
                }
              }
              else {
                testing::internal::scoped_ptr<testing::internal::String>::~scoped_ptr
                          (&gtest_ar_.message_);
                gtest_ar_.success_ = true;
                gtest_ar_._1_3_ = 0;
                iVar3 = fs_fields(this_00);
                local_e0.data_._0_4_ = iVar3;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"4","fs_fields(&ser)",(int *)&gtest_ar_,
                           (int *)&local_e0);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_);
                  if (gtest_ar.message_.ptr_ == (String *)0x0) {
                    pcVar5 = "";
                  }
                  else {
                    pcVar5 = "";
                    if ((gtest_ar.message_.ptr_)->c_str_ != (char *)0x0) {
                      pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                    }
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_e0,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                             ,0x32,pcVar5);
                  testing::internal::AssertHelper::operator=(&local_e0,(Message *)&gtest_ar_);
                  this_01 = &gtest_ar.message_;
                  testing::internal::AssertHelper::~AssertHelper(&local_e0);
                  if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
                  }
                }
                else {
                  testing::internal::scoped_ptr<testing::internal::String>::~scoped_ptr
                            (&gtest_ar.message_);
                  std::__cxx11::string::string((string *)&gtest_ar,"field1",(allocator *)&gtest_ar_)
                  ;
                  pDVar4 = ser::Serializer::FindField(this_00,(string *)&gtest_ar);
                  std::__cxx11::string::~string((string *)&gtest_ar);
                  std::__cxx11::string::string((string *)&gtest_ar,"field1",(allocator *)&local_e0);
                  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                            ((internal *)&gtest_ar_,"std::string(\"field1\")","field1.name()",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &gtest_ar,&pDVar4->name_);
                  std::__cxx11::string::~string((string *)&gtest_ar);
                  if (gtest_ar_.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar);
                    if (gtest_ar_.message_.ptr_ == (String *)0x0) {
                      pcVar5 = "";
                    }
                    else {
                      pcVar5 = "";
                      if ((gtest_ar_.message_.ptr_)->c_str_ != (char *)0x0) {
                        pcVar5 = (gtest_ar_.message_.ptr_)->c_str_;
                      }
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_e0,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                               ,0x36,pcVar5);
                    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&gtest_ar);
                    this_01 = &gtest_ar_.message_;
                    testing::internal::AssertHelper::~AssertHelper(&local_e0);
                    if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
                      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
                    }
                  }
                  else {
                    testing::internal::scoped_ptr<testing::internal::String>::~scoped_ptr
                              (&gtest_ar_.message_);
                    std::__cxx11::string::string((string *)&gtest_ar,"int",(allocator *)&local_e0);
                    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                              ((internal *)&gtest_ar_,"std::string(\"int\")","field1.type()",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &gtest_ar,&pDVar4->type_);
                    std::__cxx11::string::~string((string *)&gtest_ar);
                    if (gtest_ar_.success_ == false) {
                      testing::Message::Message((Message *)&gtest_ar);
                      if (gtest_ar_.message_.ptr_ == (String *)0x0) {
                        pcVar5 = "";
                      }
                      else {
                        pcVar5 = "";
                        if ((gtest_ar_.message_.ptr_)->c_str_ != (char *)0x0) {
                          pcVar5 = (gtest_ar_.message_.ptr_)->c_str_;
                        }
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_e0,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                 ,0x37,pcVar5);
                      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&gtest_ar);
                      this_01 = &gtest_ar_.message_;
                      testing::internal::AssertHelper::~AssertHelper(&local_e0);
                      if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
                        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
                      }
                    }
                    else {
                      testing::internal::scoped_ptr<testing::internal::String>::~scoped_ptr
                                (&gtest_ar_.message_);
                      gtest_ar_.success_ = true;
                      gtest_ar_._1_3_ = 0;
                      local_e0.data_._0_4_ = pDVar4->bytesPerElement_;
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)&gtest_ar,"4","field1.bytesPerElement()",
                                 (int *)&gtest_ar_,(int *)&local_e0);
                      if (gtest_ar.success_ == false) {
                        testing::Message::Message((Message *)&gtest_ar_);
                        if (gtest_ar.message_.ptr_ == (String *)0x0) {
                          pcVar5 = "";
                        }
                        else {
                          pcVar5 = "";
                          if ((gtest_ar.message_.ptr_)->c_str_ != (char *)0x0) {
                            pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                          }
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_e0,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                   ,0x38,pcVar5);
                        testing::internal::AssertHelper::operator=(&local_e0,(Message *)&gtest_ar_);
                        this_01 = &gtest_ar.message_;
                        testing::internal::AssertHelper::~AssertHelper(&local_e0);
                        if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
                          (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
                        }
                      }
                      else {
                        testing::internal::scoped_ptr<testing::internal::String>::~scoped_ptr
                                  (&gtest_ar.message_);
                        gtest_ar_.success_ = true;
                        gtest_ar_._1_3_ = 0;
                        local_e0.data_._0_4_ = pDVar4->rank_;
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)&gtest_ar,"2","field1.rank()",(int *)&gtest_ar_,
                                   (int *)&local_e0);
                        if (gtest_ar.success_ == false) {
                          testing::Message::Message((Message *)&gtest_ar_);
                          if (gtest_ar.message_.ptr_ == (String *)0x0) {
                            pcVar5 = "";
                          }
                          else {
                            pcVar5 = "";
                            if ((gtest_ar.message_.ptr_)->c_str_ != (char *)0x0) {
                              pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                            }
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_e0,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                     ,0x39,pcVar5);
                          testing::internal::AssertHelper::operator=
                                    (&local_e0,(Message *)&gtest_ar_);
                          this_01 = &gtest_ar.message_;
                          testing::internal::AssertHelper::~AssertHelper(&local_e0);
                          if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
                            (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
                          }
                        }
                        else {
                          testing::internal::scoped_ptr<testing::internal::String>::~scoped_ptr
                                    (&gtest_ar.message_);
                          gtest_ar_.success_ = true;
                          gtest_ar_._1_3_ = 0;
                          local_e0.data_._0_4_ = pDVar4->iSize_;
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)&gtest_ar,"42","field1.iSize()",(int *)&gtest_ar_,
                                     (int *)&local_e0);
                          if (gtest_ar.success_ == false) {
                            testing::Message::Message((Message *)&gtest_ar_);
                            if (gtest_ar.message_.ptr_ == (String *)0x0) {
                              pcVar5 = "";
                            }
                            else {
                              pcVar5 = "";
                              if ((gtest_ar.message_.ptr_)->c_str_ != (char *)0x0) {
                                pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                              }
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_e0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                       ,0x3a,pcVar5);
                            testing::internal::AssertHelper::operator=
                                      (&local_e0,(Message *)&gtest_ar_);
                            this_01 = &gtest_ar.message_;
                            testing::internal::AssertHelper::~AssertHelper(&local_e0);
                            if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
                              (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))
                                        ();
                            }
                          }
                          else {
                            testing::internal::scoped_ptr<testing::internal::String>::~scoped_ptr
                                      (&gtest_ar.message_);
                            gtest_ar_.success_ = true;
                            gtest_ar_._1_3_ = 0;
                            local_e0.data_._0_4_ = pDVar4->jSize_;
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)&gtest_ar,"1","field1.jSize()",(int *)&gtest_ar_,
                                       (int *)&local_e0);
                            if (gtest_ar.success_ == false) {
                              testing::Message::Message((Message *)&gtest_ar_);
                              if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                pcVar5 = "";
                              }
                              else {
                                pcVar5 = "";
                                if ((gtest_ar.message_.ptr_)->c_str_ != (char *)0x0) {
                                  pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                }
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_e0,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                         ,0x3b,pcVar5);
                              testing::internal::AssertHelper::operator=
                                        (&local_e0,(Message *)&gtest_ar_);
                              this_01 = &gtest_ar.message_;
                              testing::internal::AssertHelper::~AssertHelper(&local_e0);
                              if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0)
                              {
                                (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8)
                                )();
                              }
                            }
                            else {
                              testing::internal::scoped_ptr<testing::internal::String>::~scoped_ptr
                                        (&gtest_ar.message_);
                              gtest_ar_.success_ = true;
                              gtest_ar_._1_3_ = 0;
                              local_e0.data_._0_4_ = pDVar4->kSize_;
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)&gtest_ar,"1","field1.kSize()",
                                         (int *)&gtest_ar_,(int *)&local_e0);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&gtest_ar_);
                                if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                  pcVar5 = "";
                                }
                                else {
                                  pcVar5 = "";
                                  if ((gtest_ar.message_.ptr_)->c_str_ != (char *)0x0) {
                                    pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                  }
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_e0,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                           ,0x3c,pcVar5);
                                testing::internal::AssertHelper::operator=
                                          (&local_e0,(Message *)&gtest_ar_);
                                this_01 = &gtest_ar.message_;
                                testing::internal::AssertHelper::~AssertHelper(&local_e0);
                                if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0
                                   ) {
                                  (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) +
                                              8))();
                                }
                              }
                              else {
                                testing::internal::scoped_ptr<testing::internal::String>::
                                ~scoped_ptr(&gtest_ar.message_);
                                gtest_ar_.success_ = true;
                                gtest_ar_._1_3_ = 0;
                                local_e0.data_._0_4_ = pDVar4->lSize_;
                                testing::internal::CmpHelperEQ<int,int>
                                          ((internal *)&gtest_ar,"12","field1.lSize()",
                                           (int *)&gtest_ar_,(int *)&local_e0);
                                if (gtest_ar.success_ == false) {
                                  testing::Message::Message((Message *)&gtest_ar_);
                                  if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                    pcVar5 = "";
                                  }
                                  else {
                                    pcVar5 = "";
                                    if ((gtest_ar.message_.ptr_)->c_str_ != (char *)0x0) {
                                      pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                    }
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_e0,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                             ,0x3d,pcVar5);
                                  testing::internal::AssertHelper::operator=
                                            (&local_e0,(Message *)&gtest_ar_);
                                  this_01 = &gtest_ar.message_;
                                  testing::internal::AssertHelper::~AssertHelper(&local_e0);
                                  if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) !=
                                      (long *)0x0) {
                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_)
                                                + 8))();
                                  }
                                }
                                else {
                                  testing::internal::scoped_ptr<testing::internal::String>::
                                  ~scoped_ptr(&gtest_ar.message_);
                                  gtest_ar_.success_ = true;
                                  gtest_ar_._1_3_ = 0;
                                  local_e0.data_._0_4_ = pDVar4->iMinusHalo_;
                                  testing::internal::CmpHelperEQ<int,int>
                                            ((internal *)&gtest_ar,"1","field1.iMinusHaloSize()",
                                             (int *)&gtest_ar_,(int *)&local_e0);
                                  if (gtest_ar.success_ == false) {
                                    testing::Message::Message((Message *)&gtest_ar_);
                                    if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                      pcVar5 = "";
                                    }
                                    else {
                                      pcVar5 = "";
                                      if ((gtest_ar.message_.ptr_)->c_str_ != (char *)0x0) {
                                        pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                      }
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_e0,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                               ,0x3e,pcVar5);
                                    testing::internal::AssertHelper::operator=
                                              (&local_e0,(Message *)&gtest_ar_);
                                    this_01 = &gtest_ar.message_;
                                    testing::internal::AssertHelper::~AssertHelper(&local_e0);
                                    if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) !=
                                        (long *)0x0) {
                                      (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_
                                                                    ) + 8))();
                                    }
                                  }
                                  else {
                                    testing::internal::scoped_ptr<testing::internal::String>::
                                    ~scoped_ptr(&gtest_ar.message_);
                                    gtest_ar_.success_ = false;
                                    gtest_ar_._1_3_ = 0;
                                    local_e0.data_._0_4_ = pDVar4->jMinusHalo_;
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)&gtest_ar,"0","field1.jMinusHaloSize()",
                                               (int *)&gtest_ar_,(int *)&local_e0);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_);
                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                        pcVar5 = "";
                                      }
                                      else {
                                        pcVar5 = "";
                                        if ((gtest_ar.message_.ptr_)->c_str_ != (char *)0x0) {
                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                        }
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_e0,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                 ,0x3f,pcVar5);
                                      testing::internal::AssertHelper::operator=
                                                (&local_e0,(Message *)&gtest_ar_);
                                      this_01 = &gtest_ar.message_;
                                      testing::internal::AssertHelper::~AssertHelper(&local_e0);
                                      if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) !=
                                          (long *)0x0) {
                                        (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) + 8))();
                                      }
                                    }
                                    else {
                                      testing::internal::scoped_ptr<testing::internal::String>::
                                      ~scoped_ptr(&gtest_ar.message_);
                                      gtest_ar_.success_ = false;
                                      gtest_ar_._1_3_ = 0;
                                      local_e0.data_._0_4_ = pDVar4->kMinusHalo_;
                                      testing::internal::CmpHelperEQ<int,int>
                                                ((internal *)&gtest_ar,"0","field1.kMinusHaloSize()"
                                                 ,(int *)&gtest_ar_,(int *)&local_e0);
                                      if (gtest_ar.success_ == false) {
                                        testing::Message::Message((Message *)&gtest_ar_);
                                        if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                          pcVar5 = "";
                                        }
                                        else {
                                          pcVar5 = "";
                                          if ((gtest_ar.message_.ptr_)->c_str_ != (char *)0x0) {
                                            pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                          }
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_e0,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x40,pcVar5);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_e0,(Message *)&gtest_ar_);
                                        this_01 = &gtest_ar.message_;
                                        testing::internal::AssertHelper::~AssertHelper(&local_e0);
                                        if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) !=
                                            (long *)0x0) {
                                          (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                         gtest_ar_._0_4_) + 8))();
                                        }
                                      }
                                      else {
                                        testing::internal::scoped_ptr<testing::internal::String>::
                                        ~scoped_ptr(&gtest_ar.message_);
                                        gtest_ar_.success_ = true;
                                        gtest_ar_._1_3_ = 0;
                                        local_e0.data_._0_4_ = pDVar4->lMinusHalo_;
                                        testing::internal::CmpHelperEQ<int,int>
                                                  ((internal *)&gtest_ar,"2",
                                                   "field1.lMinusHaloSize()",(int *)&gtest_ar_,
                                                   (int *)&local_e0);
                                        if (gtest_ar.success_ == false) {
                                          testing::Message::Message((Message *)&gtest_ar_);
                                          if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                            pcVar5 = "";
                                          }
                                          else {
                                            pcVar5 = "";
                                            if ((gtest_ar.message_.ptr_)->c_str_ != (char *)0x0) {
                                              pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                            }
                                          }
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_e0,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x41,pcVar5);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_e0,(Message *)&gtest_ar_);
                                          this_01 = &gtest_ar.message_;
                                          testing::internal::AssertHelper::~AssertHelper(&local_e0);
                                          if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) !=
                                              (long *)0x0) {
                                            (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                           gtest_ar_._0_4_) + 8))();
                                          }
                                        }
                                        else {
                                          testing::internal::scoped_ptr<testing::internal::String>::
                                          ~scoped_ptr(&gtest_ar.message_);
                                          gtest_ar_.success_ = true;
                                          gtest_ar_._1_3_ = 0;
                                          local_e0.data_._0_4_ = pDVar4->iPlusHalo_;
                                          testing::internal::CmpHelperEQ<int,int>
                                                    ((internal *)&gtest_ar,"1",
                                                     "field1.iPlusHaloSize()",(int *)&gtest_ar_,
                                                     (int *)&local_e0);
                                          if (gtest_ar.success_ == false) {
                                            testing::Message::Message((Message *)&gtest_ar_);
                                            if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                              pcVar5 = "";
                                            }
                                            else {
                                              pcVar5 = "";
                                              if ((gtest_ar.message_.ptr_)->c_str_ != (char *)0x0) {
                                                pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                              }
                                            }
                                            testing::internal::AssertHelper::AssertHelper
                                                      (&local_e0,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x42,pcVar5);
                                            testing::internal::AssertHelper::operator=
                                                      (&local_e0,(Message *)&gtest_ar_);
                                            this_01 = &gtest_ar.message_;
                                            testing::internal::AssertHelper::~AssertHelper
                                                      (&local_e0);
                                            if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) !=
                                                (long *)0x0) {
                                              (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                             gtest_ar_._0_4_) + 8))
                                                        ();
                                            }
                                          }
                                          else {
                                            testing::internal::scoped_ptr<testing::internal::String>
                                            ::~scoped_ptr(&gtest_ar.message_);
                                            gtest_ar_.success_ = false;
                                            gtest_ar_._1_3_ = 0;
                                            local_e0.data_._0_4_ = pDVar4->jPlusHalo_;
                                            testing::internal::CmpHelperEQ<int,int>
                                                      ((internal *)&gtest_ar,"0",
                                                       "field1.jPlusHaloSize()",(int *)&gtest_ar_,
                                                       (int *)&local_e0);
                                            if (gtest_ar.success_ == false) {
                                              testing::Message::Message((Message *)&gtest_ar_);
                                              if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                pcVar5 = "";
                                              }
                                              else {
                                                pcVar5 = "";
                                                if ((gtest_ar.message_.ptr_)->c_str_ != (char *)0x0)
                                                {
                                                  pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                }
                                              }
                                              testing::internal::AssertHelper::AssertHelper
                                                        (&local_e0,kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x43,pcVar5);
                                              testing::internal::AssertHelper::operator=
                                                        (&local_e0,(Message *)&gtest_ar_);
                                              this_01 = &gtest_ar.message_;
                                              testing::internal::AssertHelper::~AssertHelper
                                                        (&local_e0);
                                              if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_)
                                                  != (long *)0x0) {
                                                (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                               gtest_ar_._0_4_) + 8)
                                                )();
                                              }
                                            }
                                            else {
                                              testing::internal::
                                              scoped_ptr<testing::internal::String>::~scoped_ptr
                                                        (&gtest_ar.message_);
                                              gtest_ar_.success_ = false;
                                              gtest_ar_._1_3_ = 0;
                                              local_e0.data_._0_4_ = pDVar4->kPlusHalo_;
                                              testing::internal::CmpHelperEQ<int,int>
                                                        ((internal *)&gtest_ar,"0",
                                                         "field1.kPlusHaloSize()",(int *)&gtest_ar_,
                                                         (int *)&local_e0);
                                              if (gtest_ar.success_ == false) {
                                                testing::Message::Message((Message *)&gtest_ar_);
                                                if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                  pcVar5 = "";
                                                }
                                                else {
                                                  pcVar5 = "";
                                                  if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                      (char *)0x0) {
                                                    pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                  }
                                                }
                                                testing::internal::AssertHelper::AssertHelper
                                                          (&local_e0,kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x44,pcVar5);
                                                testing::internal::AssertHelper::operator=
                                                          (&local_e0,(Message *)&gtest_ar_);
                                                this_01 = &gtest_ar.message_;
                                                testing::internal::AssertHelper::~AssertHelper
                                                          (&local_e0);
                                                if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_
                                                                    ) != (long *)0x0) {
                                                  (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                 gtest_ar_._0_4_) +
                                                              8))();
                                                }
                                              }
                                              else {
                                                testing::internal::
                                                scoped_ptr<testing::internal::String>::~scoped_ptr
                                                          (&gtest_ar.message_);
                                                gtest_ar_.success_ = true;
                                                gtest_ar_._1_3_ = 0;
                                                local_e0.data_._0_4_ = pDVar4->lPlusHalo_;
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)&gtest_ar,"2",
                                                           "field1.lPlusHaloSize()",
                                                           (int *)&gtest_ar_,(int *)&local_e0);
                                                if (gtest_ar.success_ == false) {
                                                  testing::Message::Message((Message *)&gtest_ar_);
                                                  if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                    pcVar5 = "";
                                                  }
                                                  else {
                                                    pcVar5 = "";
                                                    if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                        (char *)0x0) {
                                                      pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                    }
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_e0,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x45,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                }
                                                else {
                                                  testing::internal::
                                                  scoped_ptr<testing::internal::String>::~scoped_ptr
                                                            (&gtest_ar.message_);
                                                  std::__cxx11::string::string
                                                            ((string *)&gtest_ar,"field2",
                                                             (allocator *)&gtest_ar_);
                                                  pDVar4 = ser::Serializer::FindField
                                                                     (this_00,(string *)&gtest_ar);
                                                  std::__cxx11::string::~string((string *)&gtest_ar)
                                                  ;
                                                  std::__cxx11::string::string
                                                            ((string *)&gtest_ar,"field2",
                                                             (allocator *)&local_e0);
                                                  testing::internal::
                                                  CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                                            ((internal *)&gtest_ar_,
                                                             "std::string(\"field2\")",
                                                             "field2.name()",
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&gtest_ar,&pDVar4->name_);
                                                  std::__cxx11::string::~string((string *)&gtest_ar)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&gtest_ar);
                                                    if (gtest_ar_.message_.ptr_ == (String *)0x0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = "";
                                                      if ((gtest_ar_.message_.ptr_)->c_str_ !=
                                                          (char *)0x0) {
                                                        pcVar5 = (gtest_ar_.message_.ptr_)->c_str_;
                                                      }
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_e0,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x48,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar);
                                                  this_01 = &gtest_ar_.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT71(gtest_ar._1_7_,
                                                                       gtest_ar.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,
                                                                                   gtest_ar.success_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar_.message_);
                                                    std::__cxx11::string::string
                                                              ((string *)&gtest_ar,"double",
                                                               (allocator *)&local_e0);
                                                    testing::internal::
                                                                                                        
                                                  CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                                            ((internal *)&gtest_ar_,
                                                             "std::string(\"double\")",
                                                             "field2.type()",
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&gtest_ar,&pDVar4->type_);
                                                  std::__cxx11::string::~string((string *)&gtest_ar)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&gtest_ar);
                                                    if (gtest_ar_.message_.ptr_ == (String *)0x0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = "";
                                                      if ((gtest_ar_.message_.ptr_)->c_str_ !=
                                                          (char *)0x0) {
                                                        pcVar5 = (gtest_ar_.message_.ptr_)->c_str_;
                                                      }
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_e0,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x49,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar);
                                                  this_01 = &gtest_ar_.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT71(gtest_ar._1_7_,
                                                                       gtest_ar.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,
                                                                                   gtest_ar.success_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar_.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->bytesPerElement_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"8",
                                                               "field2.bytesPerElement()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x4a,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->rank_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"3",
                                                               "field2.rank()",(int *)&gtest_ar_,
                                                               (int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x4b,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->iSize_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"42",
                                                               "field2.iSize()",(int *)&gtest_ar_,
                                                               (int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x4c,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->jSize_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"28",
                                                               "field2.jSize()",(int *)&gtest_ar_,
                                                               (int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x4d,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->kSize_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"80",
                                                               "field2.kSize()",(int *)&gtest_ar_,
                                                               (int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x4e,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->lSize_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"1",
                                                               "field2.lSize()",(int *)&gtest_ar_,
                                                               (int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x4f,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->iMinusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"3",
                                                               "field2.iMinusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x50,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->jMinusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"3",
                                                               "field2.jMinusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x51,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->kMinusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "field2.kMinusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x52,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->lMinusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "field2.lMinusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x53,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->iPlusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"3",
                                                               "field2.iPlusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x54,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->jPlusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"3",
                                                               "field2.jPlusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x55,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->kPlusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"1",
                                                               "field2.kPlusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x56,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->lPlusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "field2.lPlusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x57,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    std::__cxx11::string::string
                                                              ((string *)&gtest_ar,"field3",
                                                               (allocator *)&gtest_ar_);
                                                    pDVar4 = ser::Serializer::FindField
                                                                       (this_00,(string *)&gtest_ar)
                                                    ;
                                                    std::__cxx11::string::~string
                                                              ((string *)&gtest_ar);
                                                    std::__cxx11::string::string
                                                              ((string *)&gtest_ar,"field3",
                                                               (allocator *)&local_e0);
                                                    testing::internal::
                                                                                                        
                                                  CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                                            ((internal *)&gtest_ar_,
                                                             "std::string(\"field3\")",
                                                             "field3.name()",
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&gtest_ar,&pDVar4->name_);
                                                  std::__cxx11::string::~string((string *)&gtest_ar)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&gtest_ar);
                                                    if (gtest_ar_.message_.ptr_ == (String *)0x0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = "";
                                                      if ((gtest_ar_.message_.ptr_)->c_str_ !=
                                                          (char *)0x0) {
                                                        pcVar5 = (gtest_ar_.message_.ptr_)->c_str_;
                                                      }
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_e0,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x5a,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar);
                                                  this_01 = &gtest_ar_.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT71(gtest_ar._1_7_,
                                                                       gtest_ar.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,
                                                                                   gtest_ar.success_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar_.message_);
                                                    std::__cxx11::string::string
                                                              ((string *)&gtest_ar,"int",
                                                               (allocator *)&local_e0);
                                                    testing::internal::
                                                                                                        
                                                  CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                                            ((internal *)&gtest_ar_,
                                                             "std::string(\"int\")","field3.type()",
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&gtest_ar,&pDVar4->type_);
                                                  std::__cxx11::string::~string((string *)&gtest_ar)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&gtest_ar);
                                                    if (gtest_ar_.message_.ptr_ == (String *)0x0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = "";
                                                      if ((gtest_ar_.message_.ptr_)->c_str_ !=
                                                          (char *)0x0) {
                                                        pcVar5 = (gtest_ar_.message_.ptr_)->c_str_;
                                                      }
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_e0,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x5b,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar);
                                                  this_01 = &gtest_ar_.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT71(gtest_ar._1_7_,
                                                                       gtest_ar.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,
                                                                                   gtest_ar.success_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar_.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->bytesPerElement_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"4",
                                                               "field3.bytesPerElement()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x5c,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->rank_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"2",
                                                               "field3.rank()",(int *)&gtest_ar_,
                                                               (int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x5d,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->iSize_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"42",
                                                               "field3.iSize()",(int *)&gtest_ar_,
                                                               (int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x5e,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->jSize_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"1",
                                                               "field3.jSize()",(int *)&gtest_ar_,
                                                               (int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x5f,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->kSize_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"80",
                                                               "field3.kSize()",(int *)&gtest_ar_,
                                                               (int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x60,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->lSize_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"1",
                                                               "field3.lSize()",(int *)&gtest_ar_,
                                                               (int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x61,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->iMinusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"3",
                                                               "field3.iMinusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x62,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->jMinusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "field3.jMinusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,99,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->kMinusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "field3.kMinusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,100,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->lMinusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "field3.lMinusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x65,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->iPlusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"3",
                                                               "field3.iPlusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x66,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->jPlusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "field3.jPlusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x67,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->kPlusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"1",
                                                               "field3.kPlusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x68,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->lPlusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "field3.lPlusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x69,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    std::__cxx11::string::string
                                                              ((string *)&gtest_ar,"field4",
                                                               (allocator *)&gtest_ar_);
                                                    pDVar4 = ser::Serializer::FindField
                                                                       (this_00,(string *)&gtest_ar)
                                                    ;
                                                    std::__cxx11::string::~string
                                                              ((string *)&gtest_ar);
                                                    std::__cxx11::string::string
                                                              ((string *)&gtest_ar,"field4",
                                                               (allocator *)&local_e0);
                                                    testing::internal::
                                                                                                        
                                                  CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                                            ((internal *)&gtest_ar_,
                                                             "std::string(\"field4\")",
                                                             "field4.name()",
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&gtest_ar,&pDVar4->name_);
                                                  std::__cxx11::string::~string((string *)&gtest_ar)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&gtest_ar);
                                                    if (gtest_ar_.message_.ptr_ == (String *)0x0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = "";
                                                      if ((gtest_ar_.message_.ptr_)->c_str_ !=
                                                          (char *)0x0) {
                                                        pcVar5 = (gtest_ar_.message_.ptr_)->c_str_;
                                                      }
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_e0,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x6c,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar);
                                                  this_01 = &gtest_ar_.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT71(gtest_ar._1_7_,
                                                                       gtest_ar.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,
                                                                                   gtest_ar.success_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar_.message_);
                                                    std::__cxx11::string::string
                                                              ((string *)&gtest_ar,"double",
                                                               (allocator *)&local_e0);
                                                    testing::internal::
                                                                                                        
                                                  CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
                                                            ((internal *)&gtest_ar_,
                                                             "std::string(\"double\")",
                                                             "field4.type()",
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&gtest_ar,&pDVar4->type_);
                                                  std::__cxx11::string::~string((string *)&gtest_ar)
                                                  ;
                                                  if (gtest_ar_.success_ == false) {
                                                    testing::Message::Message((Message *)&gtest_ar);
                                                    if (gtest_ar_.message_.ptr_ == (String *)0x0) {
                                                      pcVar5 = "";
                                                    }
                                                    else {
                                                      pcVar5 = "";
                                                      if ((gtest_ar_.message_.ptr_)->c_str_ !=
                                                          (char *)0x0) {
                                                        pcVar5 = (gtest_ar_.message_.ptr_)->c_str_;
                                                      }
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_e0,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x6d,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar);
                                                  this_01 = &gtest_ar_.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT71(gtest_ar._1_7_,
                                                                       gtest_ar.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,
                                                                                   gtest_ar.success_
                                                                                  ) + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar_.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->bytesPerElement_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"8",
                                                               "field4.bytesPerElement()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x6e,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->rank_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"3",
                                                               "field4.rank()",(int *)&gtest_ar_,
                                                               (int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x6f,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->iSize_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"1",
                                                               "field4.iSize()",(int *)&gtest_ar_,
                                                               (int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x70,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->jSize_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"28",
                                                               "field4.jSize()",(int *)&gtest_ar_,
                                                               (int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x71,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->kSize_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"80",
                                                               "field4.kSize()",(int *)&gtest_ar_,
                                                               (int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x72,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->lSize_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"12",
                                                               "field4.lSize()",(int *)&gtest_ar_,
                                                               (int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x73,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->iMinusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "field4.iMinusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x74,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->jMinusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"2",
                                                               "field4.jMinusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x75,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->kMinusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "field4.kMinusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x76,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->lMinusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"1",
                                                               "field4.lMinusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x77,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->iPlusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "field4.iPlusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x78,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->jPlusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"2",
                                                               "field4.jPlusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x79,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->kPlusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "field4.kPlusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x7a,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    local_e0.data_._0_4_ = pDVar4->lPlusHalo_;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"1",
                                                               "field4.lPlusHaloSize()",
                                                               (int *)&gtest_ar_,(int *)&local_e0);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x7b,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    fs_get_fieldinfo(this_00,"field1",6,
                                                                     &bytesPerElement,&iSize,&jSize,
                                                                     &kSize,&lSize,&iMinusHaloSize,
                                                                     &iPlusHaloSize,&jMinusHaloSize,
                                                                     &jPlusHaloSize,&kMinusHaloSize,
                                                                     &kPlusHaloSize,&lMinusHaloSize,
                                                                     &lPlusHaloSize);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"4",
                                                               "bytesPerElement",(int *)&gtest_ar_,
                                                               &bytesPerElement);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x86,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"42","iSize",
                                                               (int *)&gtest_ar_,&iSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x87,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"1","jSize",
                                                               (int *)&gtest_ar_,&jSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x88,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"1","kSize",
                                                               (int *)&gtest_ar_,&kSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x89,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"12","lSize",
                                                               (int *)&gtest_ar_,&lSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x8a,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"1",
                                                               "iMinusHaloSize",(int *)&gtest_ar_,
                                                               &iMinusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x8b,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "jMinusHaloSize",(int *)&gtest_ar_,
                                                               &jMinusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x8c,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "kMinusHaloSize",(int *)&gtest_ar_,
                                                               &kMinusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x8d,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"2",
                                                               "lMinusHaloSize",(int *)&gtest_ar_,
                                                               &lMinusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x8e,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"1",
                                                               "iPlusHaloSize",(int *)&gtest_ar_,
                                                               &iPlusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x8f,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "jPlusHaloSize",(int *)&gtest_ar_,
                                                               &jPlusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x90,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "kPlusHaloSize",(int *)&gtest_ar_,
                                                               &kPlusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x91,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"2",
                                                               "lPlusHaloSize",(int *)&gtest_ar_,
                                                               &lPlusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x92,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    fs_get_fieldinfo(this_00,"field2",6,
                                                                     &bytesPerElement,&iSize,&jSize,
                                                                     &kSize,&lSize,&iMinusHaloSize,
                                                                     &iPlusHaloSize,&jMinusHaloSize,
                                                                     &jPlusHaloSize,&kMinusHaloSize,
                                                                     &kPlusHaloSize,&lMinusHaloSize,
                                                                     &lPlusHaloSize);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"8",
                                                               "bytesPerElement",(int *)&gtest_ar_,
                                                               &bytesPerElement);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x98,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"42","iSize",
                                                               (int *)&gtest_ar_,&iSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x99,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"28","jSize",
                                                               (int *)&gtest_ar_,&jSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x9a,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"80","kSize",
                                                               (int *)&gtest_ar_,&kSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x9b,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"1","lSize",
                                                               (int *)&gtest_ar_,&lSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x9c,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"3",
                                                               "iMinusHaloSize",(int *)&gtest_ar_,
                                                               &iMinusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x9d,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"3",
                                                               "jMinusHaloSize",(int *)&gtest_ar_,
                                                               &jMinusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x9e,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "kMinusHaloSize",(int *)&gtest_ar_,
                                                               &kMinusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0x9f,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "lMinusHaloSize",(int *)&gtest_ar_,
                                                               &lMinusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xa0,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"3",
                                                               "iPlusHaloSize",(int *)&gtest_ar_,
                                                               &iPlusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xa1,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"3",
                                                               "jPlusHaloSize",(int *)&gtest_ar_,
                                                               &jPlusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xa2,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"1",
                                                               "kPlusHaloSize",(int *)&gtest_ar_,
                                                               &kPlusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xa3,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "lPlusHaloSize",(int *)&gtest_ar_,
                                                               &lPlusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xa4,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    fs_get_fieldinfo(this_00,"field3",6,
                                                                     &bytesPerElement,&iSize,&jSize,
                                                                     &kSize,&lSize,&iMinusHaloSize,
                                                                     &iPlusHaloSize,&jMinusHaloSize,
                                                                     &jPlusHaloSize,&kMinusHaloSize,
                                                                     &kPlusHaloSize,&lMinusHaloSize,
                                                                     &lPlusHaloSize);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"4",
                                                               "bytesPerElement",(int *)&gtest_ar_,
                                                               &bytesPerElement);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xaa,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"42","iSize",
                                                               (int *)&gtest_ar_,&iSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xab,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"1","jSize",
                                                               (int *)&gtest_ar_,&jSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xac,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"80","kSize",
                                                               (int *)&gtest_ar_,&kSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xad,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"1","lSize",
                                                               (int *)&gtest_ar_,&lSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xae,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"3",
                                                               "iMinusHaloSize",(int *)&gtest_ar_,
                                                               &iMinusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xaf,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "jMinusHaloSize",(int *)&gtest_ar_,
                                                               &jMinusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xb0,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "kMinusHaloSize",(int *)&gtest_ar_,
                                                               &kMinusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xb1,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "lMinusHaloSize",(int *)&gtest_ar_,
                                                               &lMinusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xb2,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"3",
                                                               "iPlusHaloSize",(int *)&gtest_ar_,
                                                               &iPlusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xb3,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "jPlusHaloSize",(int *)&gtest_ar_,
                                                               &jPlusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xb4,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"1",
                                                               "kPlusHaloSize",(int *)&gtest_ar_,
                                                               &kPlusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xb5,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "lPlusHaloSize",(int *)&gtest_ar_,
                                                               &lPlusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xb6,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    fs_get_fieldinfo(this_00,"field4",6,
                                                                     &bytesPerElement,&iSize,&jSize,
                                                                     &kSize,&lSize,&iMinusHaloSize,
                                                                     &iPlusHaloSize,&jMinusHaloSize,
                                                                     &jPlusHaloSize,&kMinusHaloSize,
                                                                     &kPlusHaloSize,&lMinusHaloSize,
                                                                     &lPlusHaloSize);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"8",
                                                               "bytesPerElement",(int *)&gtest_ar_,
                                                               &bytesPerElement);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xbc,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"1","iSize",
                                                               (int *)&gtest_ar_,&iSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xbd,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"28","jSize",
                                                               (int *)&gtest_ar_,&jSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xbe,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"80","kSize",
                                                               (int *)&gtest_ar_,&kSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xbf,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"12","lSize",
                                                               (int *)&gtest_ar_,&lSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xc0,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "iMinusHaloSize",(int *)&gtest_ar_,
                                                               &iMinusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xc1,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"2",
                                                               "jMinusHaloSize",(int *)&gtest_ar_,
                                                               &jMinusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xc2,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "kMinusHaloSize",(int *)&gtest_ar_,
                                                               &kMinusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xc3,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"1",
                                                               "lMinusHaloSize",(int *)&gtest_ar_,
                                                               &lMinusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xc4,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "iPlusHaloSize",(int *)&gtest_ar_,
                                                               &iPlusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xc5,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"2",
                                                               "jPlusHaloSize",(int *)&gtest_ar_,
                                                               &jPlusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,0xc6,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = false;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"0",
                                                               "kPlusHaloSize",(int *)&gtest_ar_,
                                                               &kPlusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,199,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    testing::internal::
                                                    scoped_ptr<testing::internal::String>::
                                                    ~scoped_ptr(&gtest_ar.message_);
                                                    gtest_ar_.success_ = true;
                                                    gtest_ar_._1_3_ = 0;
                                                    testing::internal::CmpHelperEQ<int,int>
                                                              ((internal *)&gtest_ar,"1",
                                                               "lPlusHaloSize",(int *)&gtest_ar_,
                                                               &lPlusHaloSize);
                                                    if (gtest_ar.success_ == false) {
                                                      testing::Message::Message
                                                                ((Message *)&gtest_ar_);
                                                      if (gtest_ar.message_.ptr_ == (String *)0x0) {
                                                        pcVar5 = "";
                                                      }
                                                      else {
                                                        pcVar5 = "";
                                                        if ((gtest_ar.message_.ptr_)->c_str_ !=
                                                            (char *)0x0) {
                                                          pcVar5 = (gtest_ar.message_.ptr_)->c_str_;
                                                        }
                                                      }
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_e0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                                                  ,200,pcVar5);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e0,(Message *)&gtest_ar_);
                                                  this_01 = &gtest_ar.message_;
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e0);
                                                  if ((long *)CONCAT44(gtest_ar_._4_4_,
                                                                       gtest_ar_._0_4_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,
                                                                                   gtest_ar_._0_4_)
                                                                + 8))();
                                                  }
                                                  }
                                                  else {
                                                    this_01 = &gtest_ar.message_;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              testing::Message::Message((Message *)&local_e0);
              testing::internal::GetBoolAssertionFailureMessage
                        ((internal *)&gtest_ar_,&gtest_ar,"fs_field_exists(&ser, \"field4\", 6)",
                         "false","true");
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&bytesPerElement,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
                         ,0x2f,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&bytesPerElement,(Message *)&local_e0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bytesPerElement);
              testing::internal::String::~String((String *)&gtest_ar_);
              if (local_e0.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_e0.data_ + 8))();
              }
            }
          }
        }
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_e0);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&gtest_ar,&gtest_ar_,"ser.fieldnames().empty()","false","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&bytesPerElement,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/unittest/wrapper/FieldUnittest.cpp"
               ,0x20,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&bytesPerElement,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bytesPerElement);
    testing::internal::String::~String((String *)&gtest_ar);
    if (local_e0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_e0.data_ + 8))();
    }
  }
  testing::internal::scoped_ptr<testing::internal::String>::~scoped_ptr(this_01);
  return;
}

Assistant:

TEST_F(FieldUnittest, Register)
{
    ASSERT_TRUE(ser.fieldnames().empty());
    ASSERT_EQ(0, fs_fields(&ser));

    // Register some fields with the C++ API
    ser.RegisterField("field1", "int"   , 4, 42,  1,  1, 12, 1, 1, 0, 0, 0, 0, 2, 2);
    ser.RegisterField("field2", "double", 8, 42, 28, 80,  1, 3, 3, 3, 3, 0, 1, 0, 0);

    // Register some fields with the C API
    fs_register_field(&ser, "field3", 6, "int"   , 3, 4, 42,  1, 80,  1, 3, 3, 0, 0, 0, 1, 0, 0);
    fs_register_field(&ser, "field4", 6, "double", 6, 8,  1, 28, 80, 12, 0, 0, 2, 2, 0, 0, 1, 1);

    // Check that fields exist
    ASSERT_TRUE(fs_field_exists(&ser, "field1", 6));
    ASSERT_TRUE(fs_field_exists(&ser, "field2", 6));
    ASSERT_TRUE(fs_field_exists(&ser, "field3", 6));
    ASSERT_TRUE(fs_field_exists(&ser, "field4", 6));

    ASSERT_EQ(4, ser.fieldnames().size());
    ASSERT_EQ(4, fs_fields(&ser));

    // Check fields
    const DataFieldInfo& field1 = ser.FindField("field1");
    ASSERT_EQ(std::string("field1"), field1.name());
    ASSERT_EQ(std::string("int"), field1.type());
    ASSERT_EQ(4, field1.bytesPerElement());
    ASSERT_EQ(2, field1.rank());
    ASSERT_EQ(42, field1.iSize());
    ASSERT_EQ( 1, field1.jSize());
    ASSERT_EQ( 1, field1.kSize());
    ASSERT_EQ(12, field1.lSize());
    ASSERT_EQ(1, field1.iMinusHaloSize());
    ASSERT_EQ(0, field1.jMinusHaloSize());
    ASSERT_EQ(0, field1.kMinusHaloSize());
    ASSERT_EQ(2, field1.lMinusHaloSize());
    ASSERT_EQ(1, field1.iPlusHaloSize());
    ASSERT_EQ(0, field1.jPlusHaloSize());
    ASSERT_EQ(0, field1.kPlusHaloSize());
    ASSERT_EQ(2, field1.lPlusHaloSize());

    const DataFieldInfo& field2 = ser.FindField("field2");
    ASSERT_EQ(std::string("field2"), field2.name());
    ASSERT_EQ(std::string("double"), field2.type());
    ASSERT_EQ(8, field2.bytesPerElement());
    ASSERT_EQ(3, field2.rank());
    ASSERT_EQ(42, field2.iSize());
    ASSERT_EQ(28, field2.jSize());
    ASSERT_EQ(80, field2.kSize());
    ASSERT_EQ(1, field2.lSize());
    ASSERT_EQ(3, field2.iMinusHaloSize());
    ASSERT_EQ(3, field2.jMinusHaloSize());
    ASSERT_EQ(0, field2.kMinusHaloSize());
    ASSERT_EQ(0, field2.lMinusHaloSize());
    ASSERT_EQ(3, field2.iPlusHaloSize());
    ASSERT_EQ(3, field2.jPlusHaloSize());
    ASSERT_EQ(1, field2.kPlusHaloSize());
    ASSERT_EQ(0, field2.lPlusHaloSize());

    const DataFieldInfo& field3 = ser.FindField("field3");
    ASSERT_EQ(std::string("field3"), field3.name());
    ASSERT_EQ(std::string("int"), field3.type());
    ASSERT_EQ(4, field3.bytesPerElement());
    ASSERT_EQ(2, field3.rank());
    ASSERT_EQ(42, field3.iSize());
    ASSERT_EQ( 1, field3.jSize());
    ASSERT_EQ(80, field3.kSize());
    ASSERT_EQ( 1, field3.lSize());
    ASSERT_EQ(3, field3.iMinusHaloSize());
    ASSERT_EQ(0, field3.jMinusHaloSize());
    ASSERT_EQ(0, field3.kMinusHaloSize());
    ASSERT_EQ(0, field3.lMinusHaloSize());
    ASSERT_EQ(3, field3.iPlusHaloSize());
    ASSERT_EQ(0, field3.jPlusHaloSize());
    ASSERT_EQ(1, field3.kPlusHaloSize());
    ASSERT_EQ(0, field3.lPlusHaloSize());

    const DataFieldInfo& field4 = ser.FindField("field4");
    ASSERT_EQ(std::string("field4"), field4.name());
    ASSERT_EQ(std::string("double"), field4.type());
    ASSERT_EQ(8, field4.bytesPerElement());
    ASSERT_EQ(3, field4.rank());
    ASSERT_EQ( 1, field4.iSize());
    ASSERT_EQ(28, field4.jSize());
    ASSERT_EQ(80, field4.kSize());
    ASSERT_EQ(12, field4.lSize());
    ASSERT_EQ(0, field4.iMinusHaloSize());
    ASSERT_EQ(2, field4.jMinusHaloSize());
    ASSERT_EQ(0, field4.kMinusHaloSize());
    ASSERT_EQ(1, field4.lMinusHaloSize());
    ASSERT_EQ(0, field4.iPlusHaloSize());
    ASSERT_EQ(2, field4.jPlusHaloSize());
    ASSERT_EQ(0, field4.kPlusHaloSize());
    ASSERT_EQ(1, field4.lPlusHaloSize());

    // Check with C API
    int bytesPerElement, iSize, jSize, kSize, lSize,
        iMinusHaloSize, iPlusHaloSize, jMinusHaloSize, jPlusHaloSize,
        kMinusHaloSize, kPlusHaloSize, lMinusHaloSize, lPlusHaloSize;

    fs_get_fieldinfo(&ser, "field1", 6,
        &bytesPerElement, &iSize, &jSize, &kSize, &lSize,
        &iMinusHaloSize, &iPlusHaloSize, &jMinusHaloSize, &jPlusHaloSize,
        &kMinusHaloSize, &kPlusHaloSize, &lMinusHaloSize, &lPlusHaloSize);
    ASSERT_EQ(4, bytesPerElement);
    ASSERT_EQ(42, iSize);
    ASSERT_EQ( 1, jSize);
    ASSERT_EQ( 1, kSize);
    ASSERT_EQ(12, lSize);
    ASSERT_EQ(1, iMinusHaloSize);
    ASSERT_EQ(0, jMinusHaloSize);
    ASSERT_EQ(0, kMinusHaloSize);
    ASSERT_EQ(2, lMinusHaloSize);
    ASSERT_EQ(1, iPlusHaloSize);
    ASSERT_EQ(0, jPlusHaloSize);
    ASSERT_EQ(0, kPlusHaloSize);
    ASSERT_EQ(2, lPlusHaloSize);

    fs_get_fieldinfo(&ser, "field2", 6,
        &bytesPerElement, &iSize, &jSize, &kSize, &lSize,
        &iMinusHaloSize, &iPlusHaloSize, &jMinusHaloSize, &jPlusHaloSize,
        &kMinusHaloSize, &kPlusHaloSize, &lMinusHaloSize, &lPlusHaloSize);
    ASSERT_EQ(8, bytesPerElement);
    ASSERT_EQ(42, iSize);
    ASSERT_EQ(28, jSize);
    ASSERT_EQ(80, kSize);
    ASSERT_EQ(1, lSize);
    ASSERT_EQ(3, iMinusHaloSize);
    ASSERT_EQ(3, jMinusHaloSize);
    ASSERT_EQ(0, kMinusHaloSize);
    ASSERT_EQ(0, lMinusHaloSize);
    ASSERT_EQ(3, iPlusHaloSize);
    ASSERT_EQ(3, jPlusHaloSize);
    ASSERT_EQ(1, kPlusHaloSize);
    ASSERT_EQ(0, lPlusHaloSize);

    fs_get_fieldinfo(&ser, "field3", 6,
        &bytesPerElement, &iSize, &jSize, &kSize, &lSize,
        &iMinusHaloSize, &iPlusHaloSize, &jMinusHaloSize, &jPlusHaloSize,
        &kMinusHaloSize, &kPlusHaloSize, &lMinusHaloSize, &lPlusHaloSize);
    ASSERT_EQ(4, bytesPerElement);
    ASSERT_EQ(42, iSize);
    ASSERT_EQ( 1, jSize);
    ASSERT_EQ(80, kSize);
    ASSERT_EQ( 1, lSize);
    ASSERT_EQ(3, iMinusHaloSize);
    ASSERT_EQ(0, jMinusHaloSize);
    ASSERT_EQ(0, kMinusHaloSize);
    ASSERT_EQ(0, lMinusHaloSize);
    ASSERT_EQ(3, iPlusHaloSize);
    ASSERT_EQ(0, jPlusHaloSize);
    ASSERT_EQ(1, kPlusHaloSize);
    ASSERT_EQ(0, lPlusHaloSize);

    fs_get_fieldinfo(&ser, "field4", 6,
        &bytesPerElement, &iSize, &jSize, &kSize, &lSize,
        &iMinusHaloSize, &iPlusHaloSize, &jMinusHaloSize, &jPlusHaloSize,
        &kMinusHaloSize, &kPlusHaloSize, &lMinusHaloSize, &lPlusHaloSize);
    ASSERT_EQ(8, bytesPerElement);
    ASSERT_EQ( 1, iSize);
    ASSERT_EQ(28, jSize);
    ASSERT_EQ(80, kSize);
    ASSERT_EQ(12, lSize);
    ASSERT_EQ(0, iMinusHaloSize);
    ASSERT_EQ(2, jMinusHaloSize);
    ASSERT_EQ(0, kMinusHaloSize);
    ASSERT_EQ(1, lMinusHaloSize);
    ASSERT_EQ(0, iPlusHaloSize);
    ASSERT_EQ(2, jPlusHaloSize);
    ASSERT_EQ(0, kPlusHaloSize);
    ASSERT_EQ(1, lPlusHaloSize);
}